

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutMerge.c
# Opt level: O3

Cut_Cut_t * Cut_CutMergeTwo2(Cut_Man_t *p,Cut_Cut_t *pCut0,Cut_Cut_t *pCut1)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  undefined1 auVar6 [16];
  Cut_Cut_t *pCVar7;
  ulong uVar8;
  ulong uVar9;
  int (*paiVar10) [3];
  uint uVar11;
  int iVar12;
  long lVar13;
  ulong uVar14;
  int iVar15;
  uint uVar16;
  uint uVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  long lVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  int iVar25;
  
  uVar16 = *(uint *)pCut0;
  uVar17 = uVar16 >> 0x1c;
  uVar1 = *(uint *)pCut1;
  uVar5 = uVar1 >> 0x1c;
  if (uVar17 < uVar5) {
    __assert_fail("pCut0->nLeaves >= pCut1->nLeaves",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/cut/cutMerge.c"
                  ,0x35,"Cut_Cut_t *Cut_CutMergeTwo2(Cut_Man_t *, Cut_Cut_t *, Cut_Cut_t *)");
  }
  uVar2 = p->pParams->nVarsMax;
  if (uVar5 == uVar2 && uVar17 == uVar2) {
    if (uVar16 < 0x10000000) {
      pCVar7 = Cut_CutAlloc(p);
    }
    else {
      uVar8 = 0;
      do {
        if (*(int *)(&pCut0[1].field_0x0 + uVar8 * 4) != *(int *)(&pCut1[1].field_0x0 + uVar8 * 4))
        {
          return (Cut_Cut_t *)0x0;
        }
        uVar8 = uVar8 + 1;
      } while (uVar17 != uVar8);
      pCVar7 = Cut_CutAlloc(p);
      if (0xfffffff < uVar16) {
        uVar8 = 0;
        do {
          *(undefined4 *)(&pCVar7[1].field_0x0 + uVar8 * 4) =
               *(undefined4 *)(&pCut0[1].field_0x0 + uVar8 * 4);
          uVar8 = uVar8 + 1;
        } while (uVar17 != uVar8);
      }
    }
  }
  else {
    if (uVar17 != uVar2) {
      uVar11 = uVar17;
      if (0xfffffff < uVar1) {
        uVar14 = 0;
        uVar8 = (ulong)(uVar16 >> 0x1c);
        iVar15 = Cut_CutMergeTwo2::M[0][1];
        iVar25 = Cut_CutMergeTwo2::M[0][0];
        iVar12 = Cut_CutMergeTwo2::M[0][2];
LAB_008dfcb0:
        do {
          uVar9 = uVar8;
          auVar6 = _DAT_0094e250;
          if ((long)uVar9 < 1) {
            if (iVar25 == 0) {
              iVar25 = *(int *)(&pCut1[1].field_0x0 + uVar14 * 4);
              Cut_CutMergeTwo2::M[0][1] = 0;
              iVar15 = 0;
              Cut_CutMergeTwo2::M[0][0] = iVar25;
            }
            else if (iVar15 == 0) {
              iVar15 = *(int *)(&pCut1[1].field_0x0 + uVar14 * 4);
              Cut_CutMergeTwo2::M[0][2] = 0;
              iVar12 = 0;
              Cut_CutMergeTwo2::M[0][1] = iVar15;
            }
            else {
              if (iVar12 != 0) {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/cut/cutMerge.c"
                              ,0x7d,
                              "Cut_Cut_t *Cut_CutMergeTwo2(Cut_Man_t *, Cut_Cut_t *, Cut_Cut_t *)");
              }
              iVar12 = *(int *)(&pCut1[1].field_0x0 + uVar14 * 4);
              Cut_CutMergeTwo2::M[0][2] = iVar12;
            }
            if ((int)uVar2 <= (int)uVar11) {
              auVar18._4_4_ = 0;
              auVar18._0_4_ = uVar17;
              auVar18._8_4_ = uVar17;
              auVar18._12_4_ = 0;
              auVar18 = auVar18 | _DAT_0094e250;
              lVar13 = 0;
              auVar24 = _DAT_0094f530;
              auVar21 = _DAT_0094e240;
              do {
                auVar23 = auVar21 ^ auVar6;
                iVar12 = auVar18._4_4_;
                if ((bool)(~(auVar23._4_4_ == iVar12 && auVar18._0_4_ < auVar23._0_4_ ||
                            iVar12 < auVar23._4_4_) & 1)) {
                  *(undefined4 *)((long)Cut_CutMergeTwo2::M[0] + lVar13) = 0;
                }
                if ((auVar23._12_4_ != auVar18._12_4_ || auVar23._8_4_ <= auVar18._8_4_) &&
                    auVar23._12_4_ <= auVar18._12_4_) {
                  *(undefined4 *)((long)Cut_CutMergeTwo2::M[1] + lVar13) = 0;
                }
                auVar23 = auVar24 ^ auVar6;
                iVar25 = auVar23._4_4_;
                if (iVar25 <= iVar12 && (iVar25 != iVar12 || auVar23._0_4_ <= auVar18._0_4_)) {
                  *(undefined4 *)((long)Cut_CutMergeTwo2::M[2] + lVar13) = 0;
                  *(undefined4 *)((long)Cut_CutMergeTwo2::M[3] + lVar13) = 0;
                }
                lVar20 = auVar21._8_8_;
                auVar21._0_8_ = auVar21._0_8_ + 4;
                auVar21._8_8_ = lVar20 + 4;
                lVar20 = auVar24._8_8_;
                auVar24._0_8_ = auVar24._0_8_ + 4;
                auVar24._8_8_ = lVar20 + 4;
                lVar13 = lVar13 + 0x30;
              } while ((ulong)((uVar16 >> 0x1c) * 4 + 0x10 & 0xfffffff0) * 3 != lVar13);
              return (Cut_Cut_t *)0x0;
            }
LAB_008dfd7c:
            uVar11 = uVar11 + 1;
          }
          else {
            iVar3 = *(int *)((long)&pCut0->pNext + uVar9 * 4 + 4);
            iVar4 = *(int *)(&pCut1[1].field_0x0 + uVar14 * 4);
            uVar8 = uVar9 - 1;
            if (iVar4 < iVar3) goto LAB_008dfcb0;
            if (iVar3 < iVar4) {
              uVar9 = uVar9 & 0xffffffff;
              if (Cut_CutMergeTwo2::M[uVar9][0] == 0) {
                Cut_CutMergeTwo2::M[uVar9][0] = iVar4;
                Cut_CutMergeTwo2::M[uVar9][1] = 0;
              }
              else if (Cut_CutMergeTwo2::M[uVar9][1] == 0) {
                Cut_CutMergeTwo2::M[uVar9][1] = iVar4;
                Cut_CutMergeTwo2::M[uVar9][2] = 0;
              }
              else {
                if (Cut_CutMergeTwo2::M[uVar9][2] != 0) {
                  __assert_fail("0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/cut/cutMerge.c"
                                ,0x69,
                                "Cut_Cut_t *Cut_CutMergeTwo2(Cut_Man_t *, Cut_Cut_t *, Cut_Cut_t *)"
                               );
                }
                Cut_CutMergeTwo2::M[uVar9][2] = iVar4;
              }
              auVar6 = _DAT_0094e250;
              if ((int)uVar2 <= (int)uVar11) {
                auVar19._4_4_ = 0;
                auVar19._0_4_ = uVar17;
                auVar19._8_4_ = uVar17;
                auVar19._12_4_ = 0;
                auVar19 = auVar19 | _DAT_0094e250;
                lVar13 = 0;
                auVar23 = _DAT_0094f530;
                auVar22 = _DAT_0094e240;
                do {
                  auVar24 = auVar22 ^ auVar6;
                  iVar12 = auVar19._4_4_;
                  if ((bool)(~(auVar24._4_4_ == iVar12 && auVar19._0_4_ < auVar24._0_4_ ||
                              iVar12 < auVar24._4_4_) & 1)) {
                    *(undefined4 *)((long)Cut_CutMergeTwo2::M[0] + lVar13) = 0;
                  }
                  if ((auVar24._12_4_ != auVar19._12_4_ || auVar24._8_4_ <= auVar19._8_4_) &&
                      auVar24._12_4_ <= auVar19._12_4_) {
                    *(undefined4 *)((long)Cut_CutMergeTwo2::M[1] + lVar13) = 0;
                  }
                  auVar24 = auVar23 ^ auVar6;
                  iVar25 = auVar24._4_4_;
                  if (iVar25 <= iVar12 && (iVar25 != iVar12 || auVar24._0_4_ <= auVar19._0_4_)) {
                    *(undefined4 *)((long)Cut_CutMergeTwo2::M[2] + lVar13) = 0;
                    *(undefined4 *)((long)Cut_CutMergeTwo2::M[3] + lVar13) = 0;
                  }
                  lVar20 = auVar22._8_8_;
                  auVar22._0_8_ = auVar22._0_8_ + 4;
                  auVar22._8_8_ = lVar20 + 4;
                  lVar20 = auVar23._8_8_;
                  auVar23._0_8_ = auVar23._0_8_ + 4;
                  auVar23._8_8_ = lVar20 + 4;
                  lVar13 = lVar13 + 0x30;
                } while ((ulong)((uVar16 >> 0x1c) * 4 + 0x10 & 0xfffffff0) * 3 != lVar13);
                return (Cut_Cut_t *)0x0;
              }
              goto LAB_008dfd7c;
            }
          }
          uVar14 = uVar14 + 1;
          uVar8 = (ulong)(uVar16 >> 0x1c);
        } while (uVar14 != uVar5);
      }
      pCVar7 = Cut_CutAlloc(p);
      uVar8 = 0;
      paiVar10 = Cut_CutMergeTwo2::M;
      uVar16 = 0;
      do {
        if (uVar8 != 0) {
          lVar13 = (long)(int)uVar16;
          uVar16 = uVar16 + 1;
          *(undefined4 *)(&pCVar7[1].field_0x0 + lVar13 * 4) =
               *(undefined4 *)((long)&pCut0->pNext + uVar8 * 4 + 4);
        }
        if ((*paiVar10)[0] != 0) {
          *(int *)(&pCVar7[1].field_0x0 + (long)(int)uVar16 * 4) = (*paiVar10)[0];
          uVar1 = uVar16 + 1;
          if ((*paiVar10)[1] != 0) {
            *(int *)(&pCVar7[1].field_0x0 + (long)(int)(uVar16 + 1) * 4) = (*paiVar10)[1];
            uVar1 = uVar16 + 2;
            if ((*paiVar10)[2] != 0) {
              *(int *)(&pCVar7[1].field_0x0 + (long)(int)(uVar16 + 2) * 4) = (*paiVar10)[2];
              uVar1 = uVar16 + 3;
            }
          }
          uVar16 = uVar1;
          (*paiVar10)[0] = 0;
        }
        uVar8 = uVar8 + 1;
        paiVar10 = paiVar10 + 1;
      } while (uVar17 + 1 != uVar8);
      if (uVar16 != uVar11) {
        __assert_fail("Count == nNodes",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/cut/cutMerge.c"
                      ,0x9a,"Cut_Cut_t *Cut_CutMergeTwo2(Cut_Man_t *, Cut_Cut_t *, Cut_Cut_t *)");
      }
      uVar16 = uVar11 << 0x1c;
      goto LAB_008dfe17;
    }
    if (0xfffffff < uVar1) {
      uVar14 = 0;
      uVar8 = (ulong)(uVar16 >> 0x1c);
      do {
        if ((long)uVar8 < 1) {
          return (Cut_Cut_t *)0x0;
        }
        lVar13 = uVar8 * 4;
        uVar8 = uVar8 - 1;
      } while ((*(int *)((long)&pCut0->pNext + lVar13 + 4) !=
                *(int *)(&pCut1[1].field_0x0 + uVar14 * 4)) ||
              (uVar14 = uVar14 + 1, uVar8 = (ulong)(uVar16 >> 0x1c), uVar14 != uVar5));
    }
    pCVar7 = Cut_CutAlloc(p);
    if (0xfffffff < uVar16) {
      uVar8 = 0;
      do {
        *(undefined4 *)(&pCVar7[1].field_0x0 + uVar8 * 4) =
             *(undefined4 *)(&pCut0[1].field_0x0 + uVar8 * 4);
        uVar8 = uVar8 + 1;
      } while (uVar17 != uVar8);
    }
  }
  uVar16 = uVar16 & 0xf0000000;
LAB_008dfe17:
  *(uint *)pCVar7 = *(uint *)pCVar7 & 0xfffffff | uVar16;
  return pCVar7;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Merges two cuts.]

  Description [This procedure works.]
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Cut_Cut_t * Cut_CutMergeTwo2( Cut_Man_t * p, Cut_Cut_t * pCut0, Cut_Cut_t * pCut1 )
{ 
    static int M[7][3] = {{0},{0},{0},{0},{0},{0},{0}};
    Cut_Cut_t * pRes;
    int * pRow;
    int nLeaves0, nLeaves1, Limit;
    int i, k, Count, nNodes;

    assert( pCut0->nLeaves >= pCut1->nLeaves );

    // the case of the largest cut sizes
    Limit = p->pParams->nVarsMax;
    nLeaves0 = pCut0->nLeaves;
    nLeaves1 = pCut1->nLeaves;
    if ( nLeaves0 == Limit && nLeaves1 == Limit )
    {
        for ( i = 0; i < nLeaves0; i++ )
            if ( pCut0->pLeaves[i] != pCut1->pLeaves[i] )
                return NULL;
        pRes = Cut_CutAlloc( p );
        for ( i = 0; i < nLeaves0; i++ )
            pRes->pLeaves[i] = pCut0->pLeaves[i];
        pRes->nLeaves = nLeaves0;
        return pRes;
    }
    // the case when one of the cuts is the largest
    if ( nLeaves0 == Limit )
    {
        for ( i = 0; i < nLeaves1; i++ )
        {
            for ( k = nLeaves0 - 1; k >= 0; k-- )
                if ( pCut0->pLeaves[k] == pCut1->pLeaves[i] )
                    break;
            if ( k == -1 ) // did not find
                return NULL;
        }
        pRes = Cut_CutAlloc( p );
        for ( i = 0; i < nLeaves0; i++ )
            pRes->pLeaves[i] = pCut0->pLeaves[i];
        pRes->nLeaves = nLeaves0;
        return pRes;
    }
    // other cases
    nNodes = nLeaves0;
    for ( i = 0; i < nLeaves1; i++ )
    {
        for ( k = nLeaves0 - 1; k >= 0; k-- )
        {
            if ( pCut0->pLeaves[k] > pCut1->pLeaves[i] )
                continue;
            if ( pCut0->pLeaves[k] < pCut1->pLeaves[i] )
            {
                pRow = M[k+1];
                if ( pRow[0] == 0 )
                    pRow[0] = pCut1->pLeaves[i], pRow[1] = 0;
                else if ( pRow[1] == 0 )
                    pRow[1] = pCut1->pLeaves[i], pRow[2] = 0;
                else if ( pRow[2] == 0 )
                    pRow[2] = pCut1->pLeaves[i];
                else 
                    assert( 0 );
                if ( ++nNodes > Limit )
                {
                    for ( i = 0; i <= nLeaves0; i++ )
                        M[i][0] = 0;
                    return NULL;
                }
            }
            break;
        }
        if ( k == -1 )
        {
            pRow = M[0];
            if ( pRow[0] == 0 )
                pRow[0] = pCut1->pLeaves[i], pRow[1] = 0;
            else if ( pRow[1] == 0 )
                pRow[1] = pCut1->pLeaves[i], pRow[2] = 0;
            else if ( pRow[2] == 0 )
                pRow[2] = pCut1->pLeaves[i];
            else 
                assert( 0 );
            if ( ++nNodes > Limit )
            {
                for ( i = 0; i <= nLeaves0; i++ )
                    M[i][0] = 0;
                return NULL;
            }
            continue;
        }
    }

    pRes = Cut_CutAlloc( p );
    for ( Count = 0, i = 0; i <= nLeaves0; i++ )
    {
        if ( i > 0 )
            pRes->pLeaves[Count++] = pCut0->pLeaves[i-1];
        pRow = M[i];
        if ( pRow[0] )
        {
            pRes->pLeaves[Count++] = pRow[0];
            if ( pRow[1] )
            {
                pRes->pLeaves[Count++] = pRow[1];
                if ( pRow[2] )
                    pRes->pLeaves[Count++] = pRow[2];
            }
            pRow[0] = 0;
        }
    }
    assert( Count == nNodes );
    pRes->nLeaves = nNodes;
    return pRes;
}